

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.c
# Opt level: O3

void do_func(int *ip)

{
  char cVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  char cVar11;
  
  if (pass != 1) {
    if (lablptr == (t_symbol *)0x0) {
      error("No name for this function!");
      return;
    }
    if (lablptr->refcnt != 0) {
      if (lablptr->type != 6) {
        if (lablptr->type != 5) {
          fatal_error("Symbol already used by a label!");
          return;
        }
        fatal_error("Symbol already used by a macro!");
      }
      fatal_error("Function already defined!");
      return;
    }
    func_install(*ip);
    return;
  }
  if ((((list_level == 0) || (xlist == 0)) || (asm_opt[0] == 0)) ||
     ((expand_macro != 0 && (asm_opt[1] == 0)))) {
    return;
  }
  if (continued_line != 0) {
    strcpy(prlnbuf,tmplnbuf);
  }
  if (data_loccnt != -1) {
    loadlc(data_loccnt,0);
    iVar5 = loccnt - data_loccnt;
    if (data_level <= list_level || iVar5 < 4) {
      if (iVar5 < 1) {
        return;
      }
      iVar10 = 0;
      do {
        iVar3 = data_size;
        iVar2 = bank;
        lVar4 = (long)bank;
        uVar6 = 0x10;
        uVar8 = 0;
        while( true ) {
          if (iVar2 < 0xf0) {
            uVar7 = (uint)rom[lVar4][data_loccnt];
            lVar9 = 2;
            do {
              cVar1 = (char)(uVar7 & 0xf);
              cVar11 = cVar1 + '0';
              if (9 < (uVar7 & 0xf)) {
                cVar11 = cVar1 + 'A';
              }
              (&DAT_0032a16f)[lVar9 + uVar6] = cVar11;
              uVar7 = uVar7 >> 4;
              lVar9 = lVar9 + -1;
            } while (lVar9 != 0);
          }
          else {
            (prlnbuf + uVar8 * 3 + 0x10)[0] = '-';
            (prlnbuf + uVar8 * 3 + 0x10)[1] = '-';
          }
          data_loccnt = data_loccnt + 1;
          uVar7 = (int)uVar8 + 1;
          uVar8 = (ulong)uVar7;
          if (uVar7 == iVar3) break;
          iVar10 = iVar10 + 1;
          uVar6 = (ulong)((int)uVar6 + 3);
          if (iVar10 == iVar5) goto LAB_0010fbfa;
        }
        fprintf((FILE *)lst_fp,"%s\n",prlnbuf);
        builtin_strncpy(prlnbuf,"                          ",0x1a);
        prlnbuf[0x1b] = '\0';
        loadlc(data_loccnt,0);
        iVar10 = iVar10 + 1;
        if (iVar10 == iVar5) {
          return;
        }
      } while( true );
    }
  }
LAB_0010fbfa:
  fprintf((FILE *)lst_fp,"%s\n",prlnbuf);
  return;
}

Assistant:

void
do_func(int *ip)
{
	if (pass == LAST_PASS)
		println();
	else {
		/* error checking */
		if (lablptr == NULL) {
			error("No name for this function!");
			return;
		}
		if (lablptr->refcnt) {
			switch (lablptr->type) {
			case MACRO:
				fatal_error("Symbol already used by a macro!");

			case FUNC:
				fatal_error("Function already defined!");
				return;

			default:
				fatal_error("Symbol already used by a label!");
				return;
			}
		}

		/* install this new function in the hash table */
		if (!func_install(*ip))
			return;
	} 
}